

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O3

_ __thiscall gjkepa2_impl::EPA::Evaluate(EPA *this,GJK *gjk,btVector3 *guess)

{
  U *pUVar1;
  sSimplex *psVar2;
  sSV *psVar3;
  sSV *c;
  undefined1 auVar4 [16];
  sFace *psVar5;
  bool bVar6;
  _ _Var7;
  sFace *psVar8;
  sFace *psVar9;
  sFace *psVar10;
  sFace *psVar11;
  U UVar12;
  sFace *psVar13;
  U UVar14;
  sSV *b;
  ulong uVar15;
  sSV *psVar16;
  sSV *psVar17;
  sFace *d;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  btScalar bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  sHorizon horizon;
  sHorizon local_88;
  sSV *local_68;
  sSV *local_60;
  sSV *local_58;
  sSV *local_50;
  btScalar local_48;
  btScalar bStack_44;
  btScalar bStack_40;
  btScalar bStack_3c;
  
  psVar2 = gjk->m_simplex;
  if ((1 < psVar2->rank) && (bVar6 = GJK::EncloseOrigin(gjk), bVar6)) {
    psVar8 = (this->m_hull).root;
    if (psVar8 != (sFace *)0x0) {
      UVar14 = (this->m_hull).count;
      UVar12 = (this->m_stock).count;
      do {
        psVar9 = psVar8->l[0];
        if (psVar8->l[1] != (sFace *)0x0) {
          psVar8->l[1]->l[0] = psVar9;
        }
        if (psVar9 != (sFace *)0x0) {
          psVar9->l[1] = psVar8->l[1];
        }
        if ((this->m_hull).root == psVar8) {
          (this->m_hull).root = psVar8->l[1];
        }
        psVar8->l[0] = (sFace *)0x0;
        psVar9 = (this->m_stock).root;
        psVar8->l[1] = psVar9;
        if (psVar9 != (sFace *)0x0) {
          psVar9->l[0] = psVar8;
        }
        (this->m_stock).root = psVar8;
        UVar12 = UVar12 + 1;
        psVar8 = (this->m_hull).root;
        UVar14 = UVar14 - 1;
      } while (psVar8 != (sFace *)0x0);
      (this->m_hull).count = UVar14;
      (this->m_stock).count = UVar12;
    }
    this->m_status = Valid;
    this->m_nextsv = 0;
    psVar16 = psVar2->c[0];
    psVar3 = psVar2->c[1];
    psVar17 = psVar2->c[3];
    fVar24 = (psVar17->w).m_floats[0];
    fVar30 = (psVar17->w).m_floats[1];
    fVar18 = (psVar16->w).m_floats[0] - fVar24;
    fVar21 = (psVar16->w).m_floats[1] - fVar30;
    fVar28 = (psVar17->w).m_floats[2];
    fVar19 = (psVar16->w).m_floats[2] - fVar28;
    fVar26 = (psVar3->w).m_floats[0] - fVar24;
    fVar20 = (psVar3->w).m_floats[1] - fVar30;
    fVar27 = (psVar3->w).m_floats[2] - fVar28;
    c = psVar2->c[2];
    fVar24 = (c->w).m_floats[0] - fVar24;
    fVar30 = (c->w).m_floats[1] - fVar30;
    fVar28 = (c->w).m_floats[2] - fVar28;
    b = psVar3;
    if ((fVar18 * fVar20 * fVar28 +
        (((fVar21 * fVar27 * fVar24 + fVar19 * fVar26 * fVar30) - fVar27 * fVar18 * fVar30) -
        fVar26 * fVar21 * fVar28)) - fVar20 * fVar19 * fVar24 < 0.0) {
      psVar2->c[0] = psVar3;
      psVar2->c[1] = psVar16;
      *(ulong *)psVar2->p =
           CONCAT44((int)*(undefined8 *)psVar2->p,(int)((ulong)*(undefined8 *)psVar2->p >> 0x20));
      b = psVar16;
      psVar16 = psVar3;
    }
    psVar8 = newface(this,psVar16,b,c,true);
    psVar9 = newface(this,psVar2->c[1],psVar2->c[0],psVar2->c[3],true);
    psVar10 = newface(this,psVar2->c[2],psVar2->c[1],psVar2->c[3],true);
    psVar11 = newface(this,psVar2->c[0],psVar2->c[2],psVar2->c[3],true);
    if ((this->m_hull).count == 4) {
      d = (this->m_hull).root;
      psVar13 = d->l[1];
      if (psVar13 != (sFace *)0x0) {
        fVar24 = d->d * d->d;
        do {
          fVar30 = psVar13->d * psVar13->d;
          psVar5 = psVar13;
          if (fVar24 <= fVar30) {
            fVar30 = fVar24;
            psVar5 = d;
          }
          d = psVar5;
          fVar24 = fVar30;
          psVar13 = psVar13->l[1];
        } while (psVar13 != (sFace *)0x0);
      }
      local_48 = (d->n).m_floats[0];
      bStack_44 = (d->n).m_floats[1];
      bStack_40 = (d->n).m_floats[2];
      bStack_3c = (d->n).m_floats[3];
      bVar25 = d->d;
      local_60 = d->c[0];
      local_58 = d->c[1];
      local_68 = d->c[2];
      UVar14 = 0;
      psVar8->e[0] = '\0';
      psVar8->f[0] = psVar9;
      psVar9->e[0] = '\0';
      psVar9->f[0] = psVar8;
      psVar8->e[1] = '\0';
      psVar8->f[1] = psVar10;
      psVar10->e[0] = '\x01';
      psVar10->f[0] = psVar8;
      psVar8->e[2] = '\0';
      psVar8->f[2] = psVar11;
      psVar11->e[0] = '\x02';
      psVar11->f[0] = psVar8;
      psVar9->e[1] = '\x02';
      psVar9->f[1] = psVar11;
      psVar11->e[2] = '\x01';
      psVar11->f[2] = psVar9;
      psVar9->e[2] = '\x01';
      psVar9->f[2] = psVar10;
      psVar10->e[1] = '\x02';
      psVar10->e[2] = '\x01';
      psVar10->f[1] = psVar9;
      psVar10->f[2] = psVar11;
      psVar11->e[1] = '\x02';
      psVar11->f[1] = psVar10;
      this->m_status = Valid;
      local_50 = this->m_sv_store;
      while( true ) {
        psVar16 = local_50;
        uVar15 = (ulong)this->m_nextsv;
        if (0x3f < uVar15) {
          this->m_status = OutOfVertices;
          goto LAB_0017b1bd;
        }
        local_88.cf = (sFace *)0x0;
        local_88.ff = (sFace *)0x0;
        local_88.nf = 0;
        this->m_nextsv = this->m_nextsv + 1;
        psVar17 = local_50 + uVar15;
        UVar14 = UVar14 + 1;
        d->pass = (U1)UVar14;
        GJK::getsupport(gjk,&d->n,psVar17);
        if (((d->n).m_floats[2] * psVar16[uVar15].w.m_floats[2] +
            (d->n).m_floats[0] * psVar16[uVar15].w.m_floats[0] +
            (d->n).m_floats[1] * psVar16[uVar15].w.m_floats[1]) - d->d <= 0.0001) break;
        uVar15 = 0;
        do {
          bVar6 = expand(this,UVar14,psVar17,d->f[uVar15],(uint)d->e[uVar15],&local_88);
          if (1 < uVar15) break;
          uVar15 = uVar15 + 1;
        } while (bVar6);
        if (!bVar6 || local_88.nf < 3) {
          _Var7 = InvalidHull;
          goto LAB_0017b1a1;
        }
        (local_88.cf)->e[1] = '\x02';
        (local_88.cf)->f[1] = local_88.ff;
        (local_88.ff)->e[2] = '\x01';
        (local_88.ff)->f[2] = local_88.cf;
        psVar8 = d->l[0];
        if (d->l[1] != (sFace *)0x0) {
          d->l[1]->l[0] = psVar8;
        }
        if (psVar8 != (sFace *)0x0) {
          psVar8->l[1] = d->l[1];
        }
        if ((this->m_hull).root == d) {
          (this->m_hull).root = d->l[1];
        }
        pUVar1 = &(this->m_hull).count;
        *pUVar1 = *pUVar1 - 1;
        d->l[0] = (sFace *)0x0;
        psVar8 = (this->m_stock).root;
        d->l[1] = psVar8;
        if (psVar8 != (sFace *)0x0) {
          psVar8->l[0] = d;
        }
        (this->m_stock).root = d;
        pUVar1 = &(this->m_stock).count;
        *pUVar1 = *pUVar1 + 1;
        d = (this->m_hull).root;
        psVar8 = d->l[1];
        if (psVar8 != (sFace *)0x0) {
          fVar24 = d->d * d->d;
          do {
            fVar30 = psVar8->d * psVar8->d;
            psVar9 = psVar8;
            if (fVar24 <= fVar30) {
              fVar30 = fVar24;
              psVar9 = d;
            }
            d = psVar9;
            fVar24 = fVar30;
            psVar8 = psVar8->l[1];
          } while (psVar8 != (sFace *)0x0);
        }
        local_48 = (d->n).m_floats[0];
        bStack_44 = (d->n).m_floats[1];
        bStack_40 = (d->n).m_floats[2];
        bStack_3c = (d->n).m_floats[3];
        bVar25 = d->d;
        local_60 = d->c[0];
        local_58 = d->c[1];
        local_68 = d->c[2];
        if (UVar14 == 0xff) {
LAB_0017b1bd:
          fVar24 = local_48 * bVar25;
          fVar28 = bStack_44 * bVar25;
          fVar30 = bStack_40 * bVar25;
          (this->m_normal).m_floats[0] = local_48;
          (this->m_normal).m_floats[1] = bStack_44;
          (this->m_normal).m_floats[2] = bStack_40;
          (this->m_normal).m_floats[3] = bStack_3c;
          this->m_depth = bVar25;
          (this->m_result).rank = 3;
          (this->m_result).c[0] = local_60;
          (this->m_result).c[1] = local_58;
          (this->m_result).c[2] = local_68;
          fVar20 = (local_58->w).m_floats[0] - fVar24;
          fVar21 = (local_58->w).m_floats[1] - fVar28;
          fVar19 = (local_58->w).m_floats[2] - fVar30;
          fVar27 = (local_68->w).m_floats[0] - fVar24;
          fVar18 = (local_68->w).m_floats[1] - fVar28;
          fVar29 = (local_68->w).m_floats[2] - fVar30;
          fVar26 = fVar21 * fVar29 - fVar18 * fVar19;
          fVar19 = fVar19 * fVar27 - fVar29 * fVar20;
          fVar18 = fVar18 * fVar20 - fVar27 * fVar21;
          auVar22._0_4_ = SQRT(fVar18 * fVar18 + fVar26 * fVar26 + fVar19 * fVar19);
          (this->m_result).p[0] = auVar22._0_4_;
          fVar20 = (local_68->w).m_floats[0] - fVar24;
          fVar21 = (local_68->w).m_floats[1] - fVar28;
          fVar19 = (local_68->w).m_floats[2] - fVar30;
          fVar27 = (local_60->w).m_floats[0] - fVar24;
          fVar18 = (local_60->w).m_floats[1] - fVar28;
          fVar29 = (local_60->w).m_floats[2] - fVar30;
          fVar26 = fVar21 * fVar29 - fVar18 * fVar19;
          fVar19 = fVar19 * fVar27 - fVar29 * fVar20;
          fVar18 = fVar18 * fVar20 - fVar27 * fVar21;
          fVar18 = SQRT(fVar18 * fVar18 + fVar26 * fVar26 + fVar19 * fVar19);
          (this->m_result).p[1] = fVar18;
          fVar20 = (local_60->w).m_floats[0] - fVar24;
          fVar21 = (local_60->w).m_floats[1] - fVar28;
          fVar19 = (local_60->w).m_floats[2] - fVar30;
          fVar24 = (local_58->w).m_floats[0] - fVar24;
          fVar28 = (local_58->w).m_floats[1] - fVar28;
          fVar30 = (local_58->w).m_floats[2] - fVar30;
          fVar26 = fVar21 * fVar30 - fVar28 * fVar19;
          fVar30 = fVar19 * fVar24 - fVar30 * fVar20;
          fVar24 = fVar28 * fVar20 - fVar24 * fVar21;
          fVar24 = SQRT(fVar24 * fVar24 + fVar26 * fVar26 + fVar30 * fVar30);
          fVar30 = auVar22._0_4_ + fVar18 + fVar24;
          auVar22._4_4_ = fVar18;
          auVar22._8_8_ = 0;
          auVar23._4_4_ = fVar30;
          auVar23._0_4_ = fVar30;
          auVar23._8_8_ = 0;
          auVar23 = divps(auVar22,auVar23);
          *(long *)(this->m_result).p = auVar23._0_8_;
          (this->m_result).p[2] = fVar24 / fVar30;
          return this->m_status;
        }
      }
      _Var7 = AccuraryReached;
LAB_0017b1a1:
      this->m_status = _Var7;
      goto LAB_0017b1bd;
    }
  }
  this->m_status = FallBack;
  fVar30 = (float)*(undefined8 *)guess->m_floats;
  fVar28 = (float)((ulong)*(undefined8 *)guess->m_floats >> 0x20);
  fVar24 = guess->m_floats[2];
  fVar18 = SQRT(fVar24 * fVar24 + fVar30 * fVar30 + fVar28 * fVar28);
  if (fVar18 <= 0.0) {
    (this->m_normal).m_floats[0] = 1.0;
    (this->m_normal).m_floats[1] = 0.0;
    (this->m_normal).m_floats[2] = 0.0;
    (this->m_normal).m_floats[3] = 0.0;
  }
  else {
    fVar18 = 1.0 / fVar18;
    auVar4._4_4_ = fVar18 * -fVar28;
    auVar4._0_4_ = fVar18 * -fVar30;
    auVar4._8_4_ = fVar18 * -fVar24;
    auVar4._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_normal).m_floats = auVar4;
  }
  this->m_depth = 0.0;
  (this->m_result).rank = 1;
  (this->m_result).c[0] = psVar2->c[0];
  (this->m_result).p[0] = 1.0;
  return FallBack;
}

Assistant:

eStatus::_			Evaluate(GJK& gjk,const btVector3& guess)
			{
				GJK::sSimplex&	simplex=*gjk.m_simplex;
				if((simplex.rank>1)&&gjk.EncloseOrigin())
				{

					/* Clean up				*/ 
					while(m_hull.root)
					{
						sFace*	f = m_hull.root;
						remove(m_hull,f);
						append(m_stock,f);
					}
					m_status	=	eStatus::Valid;
					m_nextsv	=	0;
					/* Orient simplex		*/ 
					if(gjk.det(	simplex.c[0]->w-simplex.c[3]->w,
						simplex.c[1]->w-simplex.c[3]->w,
						simplex.c[2]->w-simplex.c[3]->w)<0)
					{
						btSwap(simplex.c[0],simplex.c[1]);
						btSwap(simplex.p[0],simplex.p[1]);
					}
					/* Build initial hull	*/ 
					sFace*	tetra[]={newface(simplex.c[0],simplex.c[1],simplex.c[2],true),
						newface(simplex.c[1],simplex.c[0],simplex.c[3],true),
						newface(simplex.c[2],simplex.c[1],simplex.c[3],true),
						newface(simplex.c[0],simplex.c[2],simplex.c[3],true)};
					if(m_hull.count==4)
					{
						sFace*		best=findbest();
						sFace		outer=*best;
						U			pass=0;
						U			iterations=0;
						bind(tetra[0],0,tetra[1],0);
						bind(tetra[0],1,tetra[2],0);
						bind(tetra[0],2,tetra[3],0);
						bind(tetra[1],1,tetra[3],2);
						bind(tetra[1],2,tetra[2],1);
						bind(tetra[2],2,tetra[3],1);
						m_status=eStatus::Valid;
						for(;iterations<EPA_MAX_ITERATIONS;++iterations)
						{
							if(m_nextsv<EPA_MAX_VERTICES)
							{	
								sHorizon		horizon;
								sSV*			w=&m_sv_store[m_nextsv++];
								bool			valid=true;					
								best->pass	=	(U1)(++pass);
								gjk.getsupport(best->n,*w);
								const btScalar	wdist=btDot(best->n,w->w)-best->d;
								if(wdist>EPA_ACCURACY)
								{
									for(U j=0;(j<3)&&valid;++j)
									{
										valid&=expand(	pass,w,
											best->f[j],best->e[j],
											horizon);
									}
									if(valid&&(horizon.nf>=3))
									{
										bind(horizon.cf,1,horizon.ff,2);
										remove(m_hull,best);
										append(m_stock,best);
										best=findbest();
										outer=*best;
									} else { m_status=eStatus::InvalidHull;break; }
								} else { m_status=eStatus::AccuraryReached;break; }
							} else { m_status=eStatus::OutOfVertices;break; }
						}
						const btVector3	projection=outer.n*outer.d;
						m_normal	=	outer.n;
						m_depth		=	outer.d;
						m_result.rank	=	3;
						m_result.c[0]	=	outer.c[0];
						m_result.c[1]	=	outer.c[1];
						m_result.c[2]	=	outer.c[2];
						m_result.p[0]	=	btCross(	outer.c[1]->w-projection,
							outer.c[2]->w-projection).length();
						m_result.p[1]	=	btCross(	outer.c[2]->w-projection,
							outer.c[0]->w-projection).length();
						m_result.p[2]	=	btCross(	outer.c[0]->w-projection,
							outer.c[1]->w-projection).length();
						const btScalar	sum=m_result.p[0]+m_result.p[1]+m_result.p[2];
						m_result.p[0]	/=	sum;
						m_result.p[1]	/=	sum;
						m_result.p[2]	/=	sum;
						return(m_status);
					}
				}
				/* Fallback		*/ 
				m_status	=	eStatus::FallBack;
				m_normal	=	-guess;
				const btScalar	nl=m_normal.length();
				if(nl>0)
					m_normal	=	m_normal/nl;
				else
					m_normal	=	btVector3(1,0,0);
				m_depth	=	0;
				m_result.rank=1;
				m_result.c[0]=simplex.c[0];
				m_result.p[0]=1;	
				return(m_status);
			}